

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O1

OneofDescriptor * __thiscall
google::protobuf::Descriptor::real_oneof_decl(Descriptor *this,int index)

{
  Nonnull<const_char_*> pcVar1;
  Descriptor *unaff_RBX;
  int unaff_EBP;
  long unaff_R14;
  
  if (index < this->real_oneof_decl_count_) {
    unaff_R14 = (long)index;
    unaff_RBX = this;
    if (-1 < index) {
      pcVar1 = (Nonnull<const_char_*>)0x0;
      goto LAB_001cdaae;
    }
  }
  else {
    real_oneof_decl();
    index = unaff_EBP;
  }
  pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,unaff_R14,"0 <= index");
LAB_001cdaae:
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    if (index < unaff_RBX->oneof_decl_count_) {
      pcVar1 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (unaff_R14,(long)unaff_RBX->oneof_decl_count_,"index < oneof_decl_count()")
      ;
    }
    if (pcVar1 == (Nonnull<const_char_*>)0x0) {
      return unaff_RBX->oneof_decls_ + unaff_R14;
    }
  }
  else {
    real_oneof_decl();
  }
  real_oneof_decl();
}

Assistant:

inline const OneofDescriptor* Descriptor::real_oneof_decl(int index) const {
  ABSL_DCHECK(index < real_oneof_decl_count());
  return oneof_decl(index);
}